

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Requantize_x86_fma::forward
          (Requantize_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _elempack;
  int iVar1;
  int _w;
  Allocator *pAVar2;
  int *piVar3;
  uint uVar4;
  Allocator *pAVar5;
  ulong uVar6;
  int *piVar7;
  Mat *pMVar8;
  Mat *activation_params;
  char *pcVar9;
  int *piVar10;
  Mat *pMVar11;
  Allocator *pAVar12;
  uint uVar13;
  uint uVar14;
  int *piVar15;
  long lVar16;
  Mat *scale_out_data;
  ulong uVar17;
  long lVar18;
  long lVar19;
  Mat *local_a0;
  int *local_88;
  Mat *local_68;
  
  _elempack = bottom_blob->elempack;
  pMVar11 = (Mat *)(ulong)_elempack;
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  uVar14 = bottom_blob->h;
  lVar18 = (long)(int)_elempack;
  if (iVar1 == 3) {
    uVar13 = bottom_blob->c;
    Mat::create(top_blob,_w,uVar14,uVar13,(size_t)pMVar11,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)uVar13 < 1) {
      return 0;
    }
    lVar16 = 0;
    uVar17 = 0;
    do {
      piVar10 = (int *)(bottom_blob->cstep * uVar17 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
      pcVar9 = (char *)(top_blob->cstep * uVar17 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Requantize).scale_in_data_size < 2) {
        local_a0 = (Mat *)(this->super_Requantize).scale_in_data.data;
        piVar7 = (this->super_Requantize).scale_in_data.refcount;
        pAVar5 = (this->super_Requantize).scale_in_data.allocator;
        pMVar8 = (Mat *)(ulong)(uint)(this->super_Requantize).scale_in_data.w;
        if (piVar7 == (int *)0x0) goto LAB_0046533b;
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      else {
        local_a0 = (Mat *)((this->super_Requantize).scale_in_data.elemsize * lVar16 +
                          (long)(this->super_Requantize).scale_in_data.data);
        pAVar5 = (this->super_Requantize).scale_in_data.allocator;
        pMVar8 = pMVar11;
LAB_0046533b:
        piVar7 = (int *)0x0;
      }
      if ((this->super_Requantize).bias_data_size < 2) {
        scale_out_data = (Mat *)(this->super_Requantize).bias_data.data;
        piVar15 = (this->super_Requantize).bias_data.refcount;
        pAVar12 = (this->super_Requantize).bias_data.allocator;
        uVar14 = (this->super_Requantize).bias_data.w;
        if (piVar15 == (int *)0x0) goto LAB_0046538c;
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      else {
        scale_out_data =
             (Mat *)((this->super_Requantize).bias_data.elemsize * lVar16 +
                    (long)(this->super_Requantize).bias_data.data);
        pAVar12 = (this->super_Requantize).bias_data.allocator;
        uVar14 = _elempack;
LAB_0046538c:
        piVar15 = (int *)0x0;
      }
      if ((this->super_Requantize).scale_out_data_size < 2) {
        activation_params = (Mat *)(this->super_Requantize).scale_out_data.data;
        piVar3 = (this->super_Requantize).scale_out_data.refcount;
        uVar4 = (this->super_Requantize).scale_out_data.w;
        if (piVar3 == (int *)0x0) goto LAB_00465456;
        pAVar2 = (this->super_Requantize).scale_out_data.allocator;
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
        requantize(piVar10,pcVar9,local_a0,pMVar8,scale_out_data,uVar14,activation_params,uVar4,
                   (this->super_Requantize).activation_type);
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pAVar2 == (Allocator *)0x0) {
            if (activation_params != (Mat *)0x0) {
              free(activation_params);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])(pAVar2,activation_params);
          }
        }
      }
      else {
        activation_params =
             (Mat *)((this->super_Requantize).scale_out_data.elemsize * lVar16 +
                    (long)(this->super_Requantize).scale_out_data.data);
        uVar4 = _elempack;
LAB_00465456:
        requantize(piVar10,pcVar9,local_a0,pMVar8,scale_out_data,uVar14,activation_params,uVar4,
                   (this->super_Requantize).activation_type);
      }
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (pAVar12 == (Allocator *)0x0) {
            if (scale_out_data != (Mat *)0x0) {
              free(scale_out_data);
            }
          }
          else {
            (*pAVar12->_vptr_Allocator[3])(pAVar12,scale_out_data);
          }
        }
      }
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (pAVar5 == (Allocator *)0x0) {
            if (local_a0 != (Mat *)0x0) {
              free(local_a0);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])(pAVar5,local_a0);
          }
        }
      }
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + lVar18;
    } while (uVar13 != uVar17);
  }
  else if (iVar1 == 2) {
    Mat::create(top_blob,_w,uVar14,(size_t)pMVar11,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)uVar14 < 1) {
      return 0;
    }
    lVar16 = 0;
    uVar17 = 0;
    do {
      piVar10 = (int *)((long)bottom_blob->w * uVar17 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
      pcVar9 = (char *)((long)top_blob->w * uVar17 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Requantize).scale_in_data_size < 2) {
        local_a0 = (Mat *)(this->super_Requantize).scale_in_data.data;
        piVar7 = (this->super_Requantize).scale_in_data.refcount;
        pAVar5 = (this->super_Requantize).scale_in_data.allocator;
        local_68 = (Mat *)(ulong)(uint)(this->super_Requantize).scale_in_data.w;
        if (piVar7 == (int *)0x0) {
          piVar7 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
      }
      else {
        local_a0 = (Mat *)((this->super_Requantize).scale_in_data.elemsize * lVar16 +
                          (long)(this->super_Requantize).scale_in_data.data);
        pAVar5 = (this->super_Requantize).scale_in_data.allocator;
        piVar7 = (int *)0x0;
        local_68 = (Mat *)(ulong)_elempack;
      }
      if ((this->super_Requantize).bias_data_size < 2) {
        pMVar11 = (Mat *)(this->super_Requantize).bias_data.data;
        local_88 = (this->super_Requantize).bias_data.refcount;
        pAVar12 = (this->super_Requantize).bias_data.allocator;
        uVar13 = (this->super_Requantize).bias_data.w;
        if (local_88 == (int *)0x0) {
          local_88 = (int *)0x0;
        }
        else {
          LOCK();
          *local_88 = *local_88 + 1;
          UNLOCK();
        }
      }
      else {
        pMVar11 = (Mat *)((this->super_Requantize).bias_data.elemsize * lVar16 +
                         (long)(this->super_Requantize).bias_data.data);
        pAVar12 = (this->super_Requantize).bias_data.allocator;
        local_88 = (int *)0x0;
        uVar13 = _elempack;
      }
      if ((this->super_Requantize).scale_out_data_size < 2) {
        pMVar8 = (Mat *)(this->super_Requantize).scale_out_data.data;
        piVar15 = (this->super_Requantize).scale_out_data.refcount;
        uVar4 = (this->super_Requantize).scale_out_data.w;
        if (piVar15 == (int *)0x0) goto LAB_00465145;
        pAVar2 = (this->super_Requantize).scale_out_data.allocator;
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
        requantize(piVar10,pcVar9,local_a0,local_68,pMVar11,uVar13,pMVar8,uVar4,
                   (this->super_Requantize).activation_type);
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (pAVar2 == (Allocator *)0x0) {
            if (pMVar8 != (Mat *)0x0) {
              free(pMVar8);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar8);
          }
        }
      }
      else {
        pMVar8 = (Mat *)((this->super_Requantize).scale_out_data.elemsize * lVar16 +
                        (long)(this->super_Requantize).scale_out_data.data);
        uVar4 = _elempack;
LAB_00465145:
        requantize(piVar10,pcVar9,local_a0,local_68,pMVar11,uVar13,pMVar8,uVar4,
                   (this->super_Requantize).activation_type);
      }
      if (local_88 != (int *)0x0) {
        LOCK();
        *local_88 = *local_88 + -1;
        UNLOCK();
        if (*local_88 == 0) {
          if (pAVar12 == (Allocator *)0x0) {
            if (pMVar11 != (Mat *)0x0) {
              free(pMVar11);
            }
          }
          else {
            (*pAVar12->_vptr_Allocator[3])(pAVar12,pMVar11);
          }
        }
      }
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (pAVar5 == (Allocator *)0x0) {
            if (local_a0 != (Mat *)0x0) {
              free(local_a0);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])(pAVar5,local_a0);
          }
        }
      }
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + lVar18;
    } while (uVar14 != uVar17);
  }
  else {
    if (iVar1 != 1) {
      return 0;
    }
    Mat::create(top_blob,_w,(size_t)pMVar11,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar17 = (long)_w / (long)opt->num_threads;
    uVar6 = 1;
    if (1 < (int)uVar17) {
      uVar6 = uVar17 & 0xffffffff;
    }
    uVar17 = (long)((int)uVar6 + _w + -1) / (long)(int)uVar6;
    if ((int)uVar17 < 1) {
      return 0;
    }
    uVar17 = uVar17 & 0xffffffff;
    lVar19 = 0;
    lVar16 = 0;
    do {
      requantize((int *)((long)bottom_blob->data + lVar16),(char *)((long)top_blob->data + lVar19),
                 (Mat *)(this->super_Requantize).scale_in_data.data,
                 (Mat *)(ulong)(uint)(this->super_Requantize).scale_in_data.w,
                 (Mat *)(this->super_Requantize).bias_data.data,(this->super_Requantize).bias_data.w
                 ,(Mat *)(this->super_Requantize).scale_out_data.data,
                 (this->super_Requantize).scale_out_data.w,(this->super_Requantize).activation_type)
      ;
      lVar16 = lVar16 + lVar18 * uVar6 * 4;
      lVar19 = lVar19 + lVar18 * uVar6;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  return 0;
}

Assistant:

int Requantize_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;
    const size_t out_elemsize = elempack * 1u;

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            signed char* ptr = (signed char*)top_blob + i * elempack;

            // assert scale_in_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1
            // assert scale_out_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            requantize(intptr, ptr, scale_in_data, bias_data, scale_out_data, activation_type, activation_params, size, 1);
        }
    }

    if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const Mat scale_in_data_i = scale_in_data_size > 1 ? scale_in_data.range(i * elempack, elempack) : scale_in_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;
            const Mat scale_out_data_i = scale_out_data_size > 1 ? scale_out_data.range(i * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_i, bias_data_i, scale_out_data_i, activation_type, activation_params, w, elempack);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const Mat scale_in_data_q = scale_in_data_size > 1 ? scale_in_data.range(q * elempack, elempack) : scale_in_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;
            const Mat scale_out_data_q = scale_out_data_size > 1 ? scale_out_data.range(q * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_q, bias_data_q, scale_out_data_q, activation_type, activation_params, w * h, elempack);
        }
    }

    return 0;
}